

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O2

shared_ptr<const_QGradientCache::CacheInfo> __thiscall
QGradientCache::addCacheElement
          (QGradientCache *this,quint64 hash_val,QGradient *gradient,int opacity)

{
  const_iterator it;
  quint32 qVar1;
  InterpolationMode IVar2;
  uint uVar3;
  QRandomGenerator *this_00;
  undefined4 in_register_0000000c;
  QGradient *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_R8D;
  int i;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  shared_ptr<const_QGradientCache::CacheInfo> sVar6;
  shared_ptr<const_QGradientCache::CacheInfo> local_c8;
  QList<std::pair<double,_QColor>_> local_b8;
  iterator local_a0;
  Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
  *local_88;
  size_t sStack_80;
  Chain **local_78;
  int opacity_local;
  quint64 hash_val_local;
  QArrayDataPointer<std::pair<double,_QColor>_> local_58;
  long local_38;
  
  this_01 = (QGradient *)CONCAT44(in_register_0000000c,opacity);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  opacity_local = in_R8D;
  hash_val_local = (quint64)gradient;
  if (*(long *)(hash_val + 8) == 0x3c) {
    QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>::begin
              (&local_a0,
               (QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_> *)
               hash_val);
    this_00 = (QRandomGenerator *)QRandomGenerator64::global();
    qVar1 = QRandomGenerator::bounded(this_00,0x3c);
    local_58.size = (qsizetype)local_a0.e;
    local_58.d._0_4_ = local_a0.i.d._0_4_;
    local_58.d._4_4_ = local_a0.i.d._4_4_;
    local_58.ptr._0_4_ = (undefined4)local_a0.i.bucket;
    local_58.ptr._4_4_ = local_a0.i.bucket._4_4_;
    std::
    __advance<QMultiHash<unsigned_long_long,std::shared_ptr<QGradientCache::CacheInfo_const>>::iterator,long_long>
              (&local_58,(long)(int)qVar1);
    local_88 = (Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
                *)CONCAT44(local_58.d._4_4_,local_58.d._0_4_);
    sStack_80 = CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
    local_78 = (Chain **)local_58.size;
    it.i.bucket = sStack_80;
    it.i.d = local_88;
    it.e = (Chain **)local_58.size;
    QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>::erase
              ((iterator *)&local_58,
               (QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_> *)
               hash_val,it);
  }
  local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d.ptr = (pair<double,_QColor> *)&DAT_aaaaaaaaaaaaaaaa;
  QGradient::stops((QGradientStops *)&local_58,this_01);
  IVar2 = QGradient::interpolationMode(this_01);
  local_c8.super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_c8.
                super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._4_4_,IVar2);
  std::
  make_shared<QGradientCache::CacheInfo,QList<std::pair<double,QColor>>,int&,QGradient::InterpolationMode>
            (&local_b8,(int *)&local_58,(InterpolationMode *)&opacity_local);
  QArrayDataPointer<std::pair<double,_QColor>_>::~QArrayDataPointer(&local_58);
  generateGradientColorTable
            ((QGradientCache *)hash_val,this_01,(QRgba64 *)local_b8.d.d,0x400,opacity_local);
  lVar5 = 0;
  for (lVar4 = 0; lVar4 != 0x400; lVar4 = lVar4 + 1) {
    uVar3 = QRgba64::toArgb32((QRgba64 *)
                              ((long)&((local_b8.d.d)->super_QArrayData).ref_._q_value.
                                      super___atomic_base<int>._M_i + lVar5));
    ((QRgb *)((long)local_b8.d.d + 0x2000))[lVar4] = uVar3;
    lVar5 = lVar5 + 8;
  }
  local_c8.super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_b8.d.d;
  local_c8.super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8.d.ptr;
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = (pair<double,_QColor> *)0x0;
  QMultiHash<unsigned_long_long,std::shared_ptr<QGradientCache::CacheInfo_const>>::
  emplace<std::shared_ptr<QGradientCache::CacheInfo_const>const&>
            ((iterator *)&local_58,(void *)hash_val,&hash_val_local,&local_c8);
  std::__shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2> *)
             *(Chain **)local_58.size);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8.
              super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8.d.ptr);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    sVar6.super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    sVar6.super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<const_QGradientCache::CacheInfo>)
           sVar6.super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<const CacheInfo> addCacheElement(quint64 hash_val, const QGradient &gradient, int opacity) {
        if (cache.size() == maxCacheSize()) {
            // may remove more than 1, but OK
            cache.erase(std::next(cache.begin(), QRandomGenerator::global()->bounded(maxCacheSize())));
        }
        auto cache_entry = std::make_shared<CacheInfo>(gradient.stops(), opacity, gradient.interpolationMode());
        generateGradientColorTable(gradient, cache_entry->buffer64, paletteSize(), opacity);
        for (int i = 0; i < GRADIENT_STOPTABLE_SIZE; ++i)
            cache_entry->buffer32[i] = cache_entry->buffer64[i].toArgb32();
        return cache.insert(hash_val, std::move(cache_entry)).value();
    }